

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post.cpp
# Opt level: O0

void handlePost(int argc,char **argv,Configuration *config)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  undefined1 local_1a8 [40];
  Q q;
  undefined1 local_140 [8];
  string event;
  undefined1 local_120 [8];
  string name;
  undefined1 local_100 [8];
  string command;
  allocator local_df;
  undefined1 local_de;
  allocator local_dd [13];
  undefined1 local_d0 [8];
  Args args;
  Configuration *config_local;
  char **argv_local;
  int argc_local;
  
  args._168_8_ = config;
  Args::Args((Args *)local_d0);
  Args::limitPositionals((Args *)local_d0,3);
  Args::scan((Args *)local_d0,argc,argv);
  iVar2 = Args::getPositionalCount((Args *)local_d0);
  if (iVar2 == 1) {
    local_de = 1;
    psVar3 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(psVar3,"Queue name required.",local_dd);
    local_de = 0;
    __cxa_throw(psVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar2 = Args::getPositionalCount((Args *)local_d0);
  if (iVar2 == 2) {
    psVar3 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(psVar3,"Event file required.",&local_df);
    __cxa_throw(psVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Args::getPositional_abi_cxx11_((Args *)local_100,(int)local_d0);
  Args::getPositional_abi_cxx11_((Args *)local_120,(int)local_d0);
  Args::getPositional_abi_cxx11_((Args *)local_140,(int)local_d0);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_120,"");
  if (bVar1) {
    q._62_1_ = 1;
    psVar3 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(psVar3,"Queue name required.",(allocator *)&q.field_0x3f);
    q._62_1_ = 0;
    __cxa_throw(psVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_140,"");
  if (!bVar1) {
    Q::Q((Q *)(local_1a8 + 0x20));
    getQueueLocation((Configuration *)local_1a8,(string *)args._168_8_);
    Q::create((Q *)(local_1a8 + 0x20),(string *)local_120,(string *)local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    Q::post((Q *)(local_1a8 + 0x20),(string *)local_140);
    poVar4 = std::operator<<((ostream *)&std::cout,"Central posted event to queue ");
    poVar4 = std::operator<<(poVar4,(string *)local_120);
    std::operator<<(poVar4,".\n");
    Q::~Q((Q *)(local_1a8 + 0x20));
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_100);
    Args::~Args((Args *)local_d0);
    return;
  }
  q._60_1_ = 1;
  psVar3 = (string *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(psVar3,"Event file required.",(allocator *)&q.field_0x3d);
  q._60_1_ = 0;
  __cxa_throw(psVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void handlePost (
  int argc,
  const char** argv,
  Configuration& config)
{
  // Process arguments;
  Args args;
  args.limitPositionals (3);         // post <name> <event>
  args.scan (argc, argv);

  if (args.getPositionalCount () == 1)
    throw std::string ("Queue name required.");

  else if (args.getPositionalCount () == 2)
    throw std::string ("Event file required.");

  auto command = args.getPositional (0);
  auto name    = args.getPositional (1);
  auto event   = args.getPositional (2);

  // Validate arguments.
  if (name == "")
    throw std::string ("Queue name required.");

  if (event == "")
    throw std::string ("Event file required.");

  Q q;
  q.create (name, getQueueLocation (config, name));
  q.post (event);

  std::cout << "Central posted event to queue "
            << name
            << ".\n";
}